

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_item_scheduler.cc
# Opt level: O1

void __thiscall WorkItemScheduler::WorkItemScheduler(WorkItemScheduler *this,size_t workers_nb)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  int iVar3;
  mapped_type *pmVar4;
  system_error *psVar5;
  uint *puVar6;
  error_category *peVar7;
  long lVar8;
  mapped_type mVar9;
  error_code __ec;
  error_code __ec_00;
  error_code __ec_01;
  int socketfds [2];
  epoll_event ev;
  int local_58 [2];
  epoll_event local_50;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  *local_40;
  deque<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  *local_38;
  
  std::vector<Worker,_std::allocator<Worker>_>::vector
            (&this->workers_,workers_nb,(allocator_type *)&local_50);
  (this->work_).
  super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->work_).
  super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->work_).
  super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->work_).
  super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->work_).
  super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->work_).
  super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->work_).
  super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->work_).
  super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->work_).
  super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->work_).
  super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
  ::_M_initialize_map(&(this->work_).
                       super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
                      ,0);
  (this->dispatcher_thread_)._M_id._M_thread = 0;
  this->epoll_fd_ = -1;
  this->active_ = false;
  local_40 = &this->fd_worker_map_;
  p_Var1 = &(this->fd_worker_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->fd_worker_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fd_worker_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fd_worker_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fd_worker_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fd_worker_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = &this->work_;
  iVar3 = epoll_create1(0);
  this->epoll_fd_ = iVar3;
  if (iVar3 == -1) {
    psVar5 = (system_error *)__cxa_allocate_exception(0x20);
    puVar6 = (uint *)__errno_location();
    uVar2 = *puVar6;
    peVar7 = (error_category *)std::_V2::generic_category();
    __ec_01._4_4_ = 0;
    __ec_01._M_value = uVar2;
    __ec_01._M_cat = peVar7;
    std::system_error::system_error(psVar5,__ec_01,"Call to epoll_create1(2) failed");
    __cxa_throw(psVar5,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  if (workers_nb != 0) {
    lVar8 = 0;
    mVar9 = 0;
    do {
      local_58[0] = 0;
      local_58[1] = 0;
      iVar3 = socketpair(1,5,0,local_58);
      if (iVar3 == -1) {
        psVar5 = (system_error *)__cxa_allocate_exception(0x20);
        puVar6 = (uint *)__errno_location();
        uVar2 = *puVar6;
        peVar7 = (error_category *)std::_V2::generic_category();
        __ec._4_4_ = 0;
        __ec._M_value = uVar2;
        __ec._M_cat = peVar7;
        std::system_error::system_error(psVar5,__ec,"Call to socketpair(2) failed");
        __cxa_throw(psVar5,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      local_50.data.fd = 0;
      local_50._4_4_ = local_58[0];
      local_50.events = 1;
      iVar3 = epoll_ctl(this->epoll_fd_,1,local_58[0],&local_50);
      if (iVar3 == -1) {
        close(local_58[0]);
        close(local_58[1]);
        psVar5 = (system_error *)__cxa_allocate_exception(0x20);
        puVar6 = (uint *)__errno_location();
        uVar2 = *puVar6;
        peVar7 = (error_category *)std::_V2::generic_category();
        __ec_00._4_4_ = 0;
        __ec_00._M_value = uVar2;
        __ec_00._M_cat = peVar7;
        std::system_error::system_error(psVar5,__ec_00,"Call to epoll_ctl(2) failed");
        __cxa_throw(psVar5,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      Worker::set_socketfd
                ((Worker *)
                 ((long)&(((this->workers_).super__Vector_base<Worker,_std::allocator<Worker>_>.
                           _M_impl.super__Vector_impl_data._M_start)->thread)._M_id + lVar8),
                 local_58[1]);
      pmVar4 = std::
               map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
               ::operator[](local_40,local_58);
      *pmVar4 = mVar9;
      mVar9 = mVar9 + 1;
      lVar8 = lVar8 + 0x60;
    } while (workers_nb != mVar9);
  }
  return;
}

Assistant:

WorkItemScheduler::WorkItemScheduler(size_t workers_nb)
    : workers_(workers_nb)
{
    this->epoll_fd_ = epoll_create1(0);
    if (this->epoll_fd_ == -1)
        throw SYS_ERROR(errno, "Call to epoll_create1(2) failed");

    for (size_t i = 0; i < workers_nb; ++i)
    {
        int socketfds[2] = {0};
        if (socketpair(AF_UNIX, SOCK_SEQPACKET, 0, socketfds) == -1)
            throw SYS_ERROR(errno, "Call to socketpair(2) failed");

        struct epoll_event ev = {0};
        ev.events = EPOLLIN;
        ev.data.fd = socketfds[0];

        if (epoll_ctl(this->epoll_fd_, EPOLL_CTL_ADD, socketfds[0], &ev) == -1)
        {
            close(socketfds[0]);
            close(socketfds[1]);
            throw SYS_ERROR(errno, "Call to epoll_ctl(2) failed");
        }

        this->workers_[i].set_socketfd(socketfds[1]);
        this->fd_worker_map_[socketfds[0]] = i;
    }
}